

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viterbi.cpp
# Opt level: O2

bool MeCab::Viterbi::initPartial(Lattice *lattice)

{
  long lVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *pcVar4;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  size_t __n;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  size_t sVar5;
  undefined4 extraout_var_06;
  size_t sVar6;
  undefined **__n_00;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *pvVar7;
  void *extraout_RDX_03;
  ulong uVar8;
  size_t n;
  ulong uVar9;
  size_t i;
  size_t sVar10;
  long lVar11;
  pair<char_*,_char_*> local_c8;
  vector<std::pair<char_*,_char_*>,_std::allocator<std::pair<char_*,_char_*>_>_> tokens;
  StringBuffer os;
  char *column [2];
  vector<char_*,_std::allocator<char_*>_> lines;
  scoped_array<char> buf;
  
  iVar2 = (*lattice->_vptr_Lattice[0x12])(lattice,4);
  if ((char)iVar2 == '\0') {
    iVar2 = (*lattice->_vptr_Lattice[0x1e])(lattice);
    if ((char)iVar2 != '\0') {
      (*lattice->_vptr_Lattice[0x21])(lattice,0,1);
      iVar2 = (*lattice->_vptr_Lattice[0xb])(lattice);
      (*lattice->_vptr_Lattice[0x21])(lattice,CONCAT44(extraout_var_06,iVar2),1);
    }
  }
  else {
    iVar2 = (*lattice->_vptr_Lattice[0x16])();
    iVar3 = (*lattice->_vptr_Lattice[0xb])(lattice);
    pcVar4 = Allocator<mecab_node_t,_mecab_path_t>::partial_buffer
                       ((Allocator<mecab_node_t,_mecab_path_t> *)CONCAT44(extraout_var,iVar2),
                        CONCAT44(extraout_var_00,iVar3) + 1);
    iVar2 = (*lattice->_vptr_Lattice[8])(lattice);
    iVar3 = (*lattice->_vptr_Lattice[0xb])(lattice);
    strncpy(pcVar4,(char *)CONCAT44(extraout_var_01,iVar2),CONCAT44(extraout_var_02,iVar3) + 1);
    lines.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    lines.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    lines.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    iVar2 = (*lattice->_vptr_Lattice[0xb])(lattice);
    __n = tokenize<std::back_insert_iterator<std::vector<char*,std::allocator<char*>>>>
                    (pcVar4,"\n",&lines,CONCAT44(extraout_var_03,iVar2) + 1);
    iVar2 = (*lattice->_vptr_Lattice[0xb])(lattice);
    pcVar4 = (char *)operator_new__(CONCAT44(extraout_var_04,iVar2) + 1);
    buf._vptr_scoped_array = (_func_int **)&PTR__scoped_array_0019ecc8;
    buf.ptr_ = pcVar4;
    iVar2 = (*lattice->_vptr_Lattice[0xb])(lattice);
    os.alloc_size_ = CONCAT44(extraout_var_05,iVar2) + 1;
    __n_00 = &PTR__StringBuffer_0019f328;
    os._vptr_StringBuffer = (_func_int **)&PTR__StringBuffer_0019f328;
    os.size_ = 0;
    os.is_delete_ = false;
    os.error_ = false;
    tokens.
    super__Vector_base<std::pair<char_*,_char_*>,_std::allocator<std::pair<char_*,_char_*>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    tokens.
    super__Vector_base<std::pair<char_*,_char_*>,_std::allocator<std::pair<char_*,_char_*>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    tokens.
    super__Vector_base<std::pair<char_*,_char_*>,_std::allocator<std::pair<char_*,_char_*>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    os.ptr_ = pcVar4;
    std::vector<std::pair<char_*,_char_*>,_std::allocator<std::pair<char_*,_char_*>_>_>::reserve
              (&tokens,__n);
    pvVar7 = extraout_RDX;
    for (sVar10 = 0; __n != sVar10; sVar10 = sVar10 + 1) {
      __n_00 = (undefined **)0x2;
      sVar5 = tokenize<char**>(lines.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                               super__Vector_impl_data._M_start[sVar10],"\t",column,2);
      pcVar4 = column[0];
      if (sVar5 == 2) {
        local_c8.first = column[0];
        local_c8.second = column[1];
        std::vector<std::pair<char*,char*>,std::allocator<std::pair<char*,char*>>>::
        emplace_back<std::pair<char*,char*>>
                  ((vector<std::pair<char*,char*>,std::allocator<std::pair<char*,char*>>> *)&tokens,
                   &local_c8);
        pvVar7 = extraout_RDX_02;
      }
      else {
        if ((sVar5 == 1) && (iVar2 = strcmp(column[0],"EOS"), pvVar7 = extraout_RDX_00, iVar2 == 0))
        break;
        local_c8.first = pcVar4;
        local_c8.second = (char *)0x0;
        std::vector<std::pair<char*,char*>,std::allocator<std::pair<char*,char*>>>::
        emplace_back<std::pair<char*,char*>>
                  ((vector<std::pair<char*,char*>,std::allocator<std::pair<char*,char*>>> *)&tokens,
                   &local_c8);
        pvVar7 = extraout_RDX_01;
      }
      StringBuffer::write(&os,(int)column[0],pvVar7,(size_t)__n_00);
      pvVar7 = extraout_RDX_03;
    }
    StringBuffer::write(&os,0,pvVar7,(size_t)__n_00);
    pcVar4 = os.ptr_;
    if (os.error_ != false) {
      pcVar4 = (char *)0x0;
    }
    (*lattice->_vptr_Lattice[9])(lattice,pcVar4);
    lVar11 = 0;
    for (uVar8 = 0;
        uVar8 < (ulong)((long)tokens.
                              super__Vector_base<std::pair<char_*,_char_*>,_std::allocator<std::pair<char_*,_char_*>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)tokens.
                              super__Vector_base<std::pair<char_*,_char_*>,_std::allocator<std::pair<char_*,_char_*>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 4); uVar8 = uVar8 + 1) {
      pcVar4 = tokens.
               super__Vector_base<std::pair<char_*,_char_*>,_std::allocator<std::pair<char_*,_char_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar8].second;
      sVar6 = strlen(tokens.
                     super__Vector_base<std::pair<char_*,_char_*>,_std::allocator<std::pair<char_*,_char_*>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar8].first);
      (*lattice->_vptr_Lattice[0x21])(lattice,lVar11,1);
      lVar1 = sVar6 + lVar11;
      (*lattice->_vptr_Lattice[0x21])(lattice,lVar1,1);
      if (pcVar4 != (char *)0x0) {
        (*lattice->_vptr_Lattice[0x22])(lattice,lVar11,lVar1,pcVar4);
        for (uVar9 = 1; uVar9 < sVar6; uVar9 = uVar9 + 1) {
          (*lattice->_vptr_Lattice[0x21])(lattice,lVar11 + uVar9,2);
        }
      }
      lVar11 = lVar1;
    }
    std::_Vector_base<std::pair<char_*,_char_*>,_std::allocator<std::pair<char_*,_char_*>_>_>::
    ~_Vector_base(&tokens.
                   super__Vector_base<std::pair<char_*,_char_*>,_std::allocator<std::pair<char_*,_char_*>_>_>
                 );
    StringBuffer::~StringBuffer(&os);
    scoped_array<char>::~scoped_array(&buf);
    std::_Vector_base<char_*,_std::allocator<char_*>_>::~_Vector_base
              (&lines.super__Vector_base<char_*,_std::allocator<char_*>_>);
  }
  return true;
}

Assistant:

bool Viterbi::initPartial(Lattice *lattice) {
  if (!lattice->has_request_type(MECAB_PARTIAL)) {
    if (lattice->has_constraint()) {
      lattice->set_boundary_constraint(0, MECAB_TOKEN_BOUNDARY);
      lattice->set_boundary_constraint(lattice->size(),
                                       MECAB_TOKEN_BOUNDARY);
    }
    return true;
  }

  Allocator<Node, Path> *allocator = lattice->allocator();
  char *str = allocator->partial_buffer(lattice->size() + 1);
  strncpy(str, lattice->sentence(), lattice->size() + 1);

  std::vector<char *> lines;
  const size_t lsize = tokenize(str, "\n",
                                std::back_inserter(lines),
                                lattice->size() + 1);
  char* column[2];
  scoped_array<char> buf(new char[lattice->size() + 1]);
  StringBuffer os(buf.get(), lattice->size() + 1);

  std::vector<std::pair<char *, char *> > tokens;
  tokens.reserve(lsize);

  size_t pos = 0;
  for (size_t i = 0; i < lsize; ++i) {
    const size_t size = tokenize(lines[i], "\t", column, 2);
    if (size == 1 && std::strcmp(column[0], "EOS") == 0) {
      break;
    }
    const size_t len = std::strlen(column[0]);
    if (size == 2) {
      tokens.push_back(std::make_pair(column[0], column[1]));
    } else {
      tokens.push_back(std::make_pair(column[0], reinterpret_cast<char *>(0)));
    }
    os << column[0];
    pos += len;
  }

  os << '\0';

  lattice->set_sentence(os.str());

  pos = 0;
  for (size_t i = 0; i < tokens.size(); ++i) {
    const char *surface = tokens[i].first;
    const char *feature = tokens[i].second;
    const size_t len = std::strlen(surface);
    lattice->set_boundary_constraint(pos, MECAB_TOKEN_BOUNDARY);
    lattice->set_boundary_constraint(pos + len, MECAB_TOKEN_BOUNDARY);
    if (feature) {
      lattice->set_feature_constraint(pos, pos + len, feature);
      for (size_t n = 1; n < len; ++n) {
        lattice->set_boundary_constraint(pos + n,
                                         MECAB_INSIDE_TOKEN);
      }
    }
    pos += len;
  }

  return true;
}